

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

Device * Fossilize::get_device_layer(VkDevice device)

{
  int iVar1;
  const_iterator cVar2;
  Device *pDVar3;
  VkDevice local_10;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)globalLock);
  if (iVar1 == 0) {
    local_10 = device;
    cVar2 = std::
            _Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)deviceData,&local_10);
    if (cVar2.
        super__Node_iterator_base<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      pDVar3 = (Device *)0x0;
    }
    else {
      pDVar3 = *(Device **)
                ((long)cVar2.
                       super__Node_iterator_base<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_false>
                       ._M_cur + 0x10);
    }
    pthread_mutex_unlock((pthread_mutex_t *)globalLock);
    return pDVar3;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

static Device *get_device_layer(VkDevice device)
{
	// Need to hold a lock while querying the global hashmap, but not after it.
	Device *layer = nullptr;
	void *key = getDispatchKey(device);
	lock_guard<mutex> holder{ globalLock };
	layer = getLayerData(key, deviceData);
	return layer;
}